

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,avector<AffineSpace3ff> *spaces,Ref<embree::SceneGraph::Node> *child)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  void *pvVar5;
  long *plVar6;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t i;
  bool in_stack_fffffffffffffeaf;
  Node *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  undefined4 local_e0;
  undefined4 local_dc [3];
  undefined8 *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined8 *local_b8;
  ulong local_b0;
  long local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  Node::Node(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
  *in_RDI = &PTR__TransformNode_006200c0;
  local_d0 = in_RDI + 0xd;
  local_dc[0] = 0;
  local_e0 = 0x3f800000;
  local_c0 = local_dc;
  local_c8 = &local_e0;
  *(undefined4 *)local_d0 = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0x3f800000;
  local_a0 = in_RDI + 0xe;
  in_RDI[0xf] = *(undefined8 *)(in_RSI + 8);
  in_RDI[0x10] = *(undefined8 *)(in_RSI + 0x10);
  local_98 = in_RDI[0x10];
  local_b8 = local_d0;
  local_a8 = in_RSI;
  local_90 = local_a0;
  pvVar5 = alignedMalloc(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  in_RDI[0x11] = pvVar5;
  for (local_b0 = 0; local_b0 < (ulong)in_RDI[0xf]; local_b0 = local_b0 + 1) {
    local_80 = (undefined8 *)(in_RDI[0x11] + local_b0 * 0x40);
    local_88 = (undefined8 *)(*(long *)(local_a8 + 0x18) + local_b0 * 0x40);
    local_58 = local_80 + 2;
    local_60 = local_80 + 4;
    local_48 = local_80 + 6;
    uVar4 = local_88[1];
    *local_80 = *local_88;
    local_80[1] = uVar4;
    local_20 = local_88 + 2;
    local_18 = local_80 + 2;
    uVar4 = local_88[3];
    *local_18 = *local_20;
    local_80[3] = uVar4;
    local_30 = local_88 + 4;
    local_28 = local_80 + 4;
    uVar4 = local_88[5];
    *local_28 = *local_30;
    local_80[5] = uVar4;
    local_78 = local_88 + 6;
    local_70 = local_80 + 6;
    uVar1 = *(undefined4 *)((long)local_88 + 0x34);
    uVar2 = *(undefined4 *)(local_88 + 7);
    uVar3 = *(undefined4 *)((long)local_88 + 0x3c);
    *(undefined4 *)local_70 = *(undefined4 *)local_78;
    *(undefined4 *)((long)local_80 + 0x34) = uVar1;
    *(undefined4 *)(local_80 + 7) = uVar2;
    *(undefined4 *)((long)local_80 + 0x3c) = uVar3;
    local_68 = local_80;
    local_50 = local_80;
    local_40 = local_88;
    local_38 = local_80;
    local_10 = local_88;
    local_8 = local_80;
  }
  *(undefined1 *)(in_RDI + 0x12) = 0;
  plVar6 = in_RDI + 0x13;
  *plVar6 = *in_RDX;
  if (*plVar6 != 0) {
    (**(code **)(*(long *)*plVar6 + 0x10))();
  }
  return;
}

Assistant:

TransformNode (const avector<AffineSpace3ff>& spaces, const Ref<Node>& child)
        : spaces(spaces), child(child) {}